

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase233::run(TestCase233 *this)

{
  Builder builder;
  Reader reader;
  uint uVar1;
  int fd;
  LowLevelAsyncIoProvider *pLVar2;
  RefOrVoid<kj::AsyncInputStream> pAVar3;
  MessageReader *this_00;
  ReaderOptions options;
  ArrayPtr<capnp::word> scratchSpace;
  undefined8 in_stack_fffffffffffffd80;
  Reader local_258;
  ArrayPtr<capnp::word> local_228;
  ReaderOptions local_218;
  Promise<kj::Own<capnp::MessageReader>_> local_208;
  undefined1 local_1f8 [8];
  Own<capnp::MessageReader> received;
  Function<void_()> local_1d8;
  undefined1 local_1c8 [8];
  Thread thread;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined1 local_188 [8];
  TestMessageBuilder message;
  FragmentingOutputStream output;
  SocketOutputStream rawOutput;
  Own<kj::AsyncInputStream> input;
  undefined1 local_48 [8];
  AsyncIoContext ioContext;
  PipeWithSmallBuffer fds;
  TestCase233 *this_local;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  kj::setupAsyncIo();
  pLVar2 = kj::Own<kj::LowLevelAsyncIoProvider>::operator->
                     ((Own<kj::LowLevelAsyncIoProvider> *)local_48);
  uVar1 = PipeWithSmallBuffer::operator[]((PipeWithSmallBuffer *)&ioContext.unixEventPort,0);
  (**pLVar2->_vptr_LowLevelAsyncIoProvider)
            (&rawOutput.autoclose.unwindDetector,pLVar2,(ulong)uVar1,0);
  fd = PipeWithSmallBuffer::operator[]((PipeWithSmallBuffer *)&ioContext.unixEventPort,1);
  kj::FdOutputStream::FdOutputStream((FdOutputStream *)&output.inner,fd);
  FragmentingOutputStream::FragmentingOutputStream
            ((FragmentingOutputStream *)&message.desiredSegmentCount,(OutputStream *)&output.inner);
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_188,7);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&thread.detached,(MessageBuilder *)local_188);
  builder._builder.capTable = (CapTableBuilder *)local_1a0;
  builder._builder.segment = (SegmentBuilder *)uStack_1a8;
  builder._builder.data = (void *)uStack_198;
  builder._builder.pointers = (WirePointer *)local_190;
  builder._builder.dataSize = (int)in_stack_fffffffffffffd80;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd80 >> 0x30);
  initTestMessage(builder);
  received.ptr = (MessageReader *)&message.desiredSegmentCount;
  kj::Function<void()>::Function<capnp::_::(anonymous_namespace)::TestCase233::run()::__0>
            ((Function<void()> *)&local_1d8,(Type *)&received.ptr);
  kj::Thread::Thread((Thread *)local_1c8,&local_1d8);
  kj::Function<void_()>::~Function(&local_1d8);
  pAVar3 = kj::Own<kj::AsyncInputStream>::operator*
                     ((Own<kj::AsyncInputStream> *)&rawOutput.autoclose.unwindDetector);
  local_218.traversalLimitInWords = 0;
  local_218._8_8_ = 0;
  ReaderOptions::ReaderOptions(&local_218);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_228,(void *)0x0);
  scratchSpace.ptr = (word *)(local_218._8_8_ & 0xffffffff);
  options._8_8_ = local_218.traversalLimitInWords;
  options.traversalLimitInWords = (uint64_t)pAVar3;
  scratchSpace.size_ = (size_t)local_228.ptr;
  readMessage((AsyncInputStream *)&local_208,options,scratchSpace);
  kj::Promise<kj::Own<capnp::MessageReader>_>::wait
            ((Promise<kj::Own<capnp::MessageReader>_> *)local_1f8,&local_208);
  kj::Promise<kj::Own<capnp::MessageReader>_>::~Promise(&local_208);
  this_00 = kj::Own<capnp::MessageReader>::operator->((Own<capnp::MessageReader> *)local_1f8);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>(&local_258,this_00);
  reader._reader.capTable = (CapTableReader *)local_258._reader.data;
  reader._reader.segment = (SegmentReader *)local_258._reader.capTable;
  reader._reader.data = local_258._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_258._reader._32_8_;
  reader._reader.dataSize = local_258._reader.nestingLimit;
  reader._reader.pointerCount = local_258._reader._44_2_;
  reader._reader._38_2_ = local_258._reader._46_2_;
  reader._reader._40_8_ = this_00;
  checkTestMessage(reader);
  kj::Own<capnp::MessageReader>::~Own((Own<capnp::MessageReader> *)local_1f8);
  kj::Thread::~Thread((Thread *)local_1c8);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_188);
  FragmentingOutputStream::~FragmentingOutputStream
            ((FragmentingOutputStream *)&message.desiredSegmentCount);
  kj::FdOutputStream::~FdOutputStream((FdOutputStream *)&output.inner);
  kj::Own<kj::AsyncInputStream>::~Own
            ((Own<kj::AsyncInputStream> *)&rawOutput.autoclose.unwindDetector);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)local_48);
  PipeWithSmallBuffer::~PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  return;
}

Assistant:

TEST(SerializeAsyncTest, ParseAsyncOddSegmentCount) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto input = ioContext.lowLevelProvider->wrapInputFd(fds[0]);
  SocketOutputStream rawOutput(fds[1]);
  FragmentingOutputStream output(rawOutput);

  TestMessageBuilder message(7);
  initTestMessage(message.getRoot<TestAllTypes>());

  kj::Thread thread([&]() {
    writeMessage(output, message);
  });

  auto received = readMessage(*input).wait(ioContext.waitScope);

  checkTestMessage(received->getRoot<TestAllTypes>());
}